

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkGear.cpp
# Opt level: O3

ChVector<double> * __thiscall
chrono::ChLinkGear::Get_shaft_pos1(ChVector<double> *__return_storage_ptr__,ChLinkGear *this)

{
  ChQuaternion<double> local_c0;
  ChFrame<double> local_a0;
  
  local_a0.coord.pos.m_data[2] = DAT_00b689a8;
  local_a0.coord.pos.m_data[0] = VNULL;
  local_a0.coord.pos.m_data[1] = DAT_00b689a0;
  if ((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1 != (ChBodyFrame *)0x0) {
    local_c0.m_data[0] = 1.0;
    local_c0.m_data[1] = 0.0;
    local_c0.m_data[2] = 0.0;
    local_c0.m_data[3] = 0.0;
    local_a0._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
    local_a0.coord.pos.m_data[0] = 0.0;
    local_a0.coord.pos.m_data[1] = 0.0;
    local_a0.coord.pos.m_data[2] = 0.0;
    local_a0.coord.rot.m_data[0] = 1.0;
    local_a0.coord.rot.m_data[1] = 0.0;
    local_a0.coord.rot.m_data[2] = 0.0;
    local_a0.coord.rot.m_data[3] = 0.0;
    ChMatrix33<double>::ChMatrix33(&local_a0.Amatrix,&local_c0);
    ChFrame<double>::TransformLocalToParent
              ((ChFrame<double> *)(this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1,
               &this->local_shaft1,&local_a0);
  }
  __return_storage_ptr__->m_data[0] = local_a0.coord.pos.m_data[0];
  __return_storage_ptr__->m_data[1] = local_a0.coord.pos.m_data[1];
  __return_storage_ptr__->m_data[2] = local_a0.coord.pos.m_data[2];
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChLinkGear::Get_shaft_pos1() const {
    if (Body1) {
        ChFrame<double> absframe;
        ((ChFrame<double>*)Body1)->TransformLocalToParent(local_shaft1, absframe);
        return absframe.GetPos();
    } else
        return VNULL;
}